

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

parasail_profile_t * parasail_profile_new(char *s1,int s1Len,parasail_matrix_t *matrix)

{
  int iVar1;
  parasail_profile_t *ppVar2;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_new_cold_3();
  }
  else {
    iVar1 = matrix->type;
    if (s1 == (char *)0x0 && iVar1 == 0) {
      parasail_profile_new_cold_1();
    }
    else {
      ppVar2 = (parasail_profile_t *)malloc(0x88);
      if (ppVar2 != (parasail_profile_t *)0x0) {
        ppVar2->s1 = s1;
        ppVar2->s1Len = s1Len;
        ppVar2->matrix = matrix;
        (ppVar2->profile8).score = (void *)0x0;
        (ppVar2->profile8).matches = (void *)0x0;
        (ppVar2->profile8).similar = (void *)0x0;
        (ppVar2->profile16).score = (void *)0x0;
        (ppVar2->profile16).matches = (void *)0x0;
        (ppVar2->profile16).similar = (void *)0x0;
        (ppVar2->profile32).score = (void *)0x0;
        (ppVar2->profile32).matches = (void *)0x0;
        (ppVar2->profile32).similar = (void *)0x0;
        (ppVar2->profile64).score = (void *)0x0;
        (ppVar2->profile64).matches = (void *)0x0;
        (ppVar2->profile64).similar = (void *)0x0;
        ppVar2->free = (_func_void_void_ptr *)0x0;
        ppVar2->stop = 0x7fffffff;
        if (iVar1 != 1) {
          return ppVar2;
        }
        ppVar2->s1Len = matrix->length;
        return ppVar2;
      }
      parasail_profile_new_cold_2();
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t* parasail_profile_new(
        const char * s1, const int s1Len, const parasail_matrix_t *matrix)
{
    /* declare all variables */
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    PARASAIL_NEW(profile, parasail_profile_t);

    profile->s1 = s1;
    profile->s1Len = s1Len;
    profile->matrix = matrix;
    profile->profile8.score = NULL;
    profile->profile8.matches = NULL;
    profile->profile8.similar = NULL;
    profile->profile16.score = NULL;
    profile->profile16.matches = NULL;
    profile->profile16.similar = NULL;
    profile->profile32.score = NULL;
    profile->profile32.matches = NULL;
    profile->profile32.similar = NULL;
    profile->profile64.score = NULL;
    profile->profile64.matches = NULL;
    profile->profile64.similar = NULL;
    profile->free = NULL;
    profile->stop = INT32_MAX;

    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        profile->s1Len = matrix->length;
    }

    return profile;
}